

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

time_double
time_function<unsigned_int,libdivide::divider<unsigned_int,(libdivide::Branching)0>>
          (random_numerators<unsigned_int> *vals,
          divider<unsigned_int,_(libdivide::Branching)0> denom,
          pFuncToTime<unsigned_int,_libdivide::divider<unsigned_int>_> timeFunc)

{
  time_double tVar1;
  uint64_t uVar2;
  code *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  timer t;
  time_double tresult;
  timer local_48;
  code *local_28;
  undefined8 local_20;
  undefined4 local_15;
  undefined1 local_11;
  uint64_t local_8;
  
  local_15 = (undefined4)in_RSI;
  local_11 = (undefined1)((ulong)in_RSI >> 0x20);
  local_28 = in_RDX;
  local_20 = in_RDI;
  timer::timer(&local_48);
  timer::start((timer *)0x102208);
  local_8 = (*local_28)(local_20,&local_15);
  timer::stop((timer *)0x102228);
  uVar2 = timer::duration_nano(&local_48);
  tVar1.result = local_8;
  tVar1.time = uVar2;
  return tVar1;
}

Assistant:

NOINLINE static time_double time_function(
    const random_numerators<IntT> &vals, DenomT denom, pFuncToTime<IntT, DenomT> timeFunc) {
    time_double tresult;

    timer t;
    t.start();
    tresult.result = timeFunc(vals, denom);
    t.stop();
    tresult.time = t.duration_nano();
    return tresult;
}